

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

bool f_noncentral_check(double a,int m,int n)

{
  char *pcVar1;
  
  if (a <= 0.0) {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"F_NONCENTRAL_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cerr,"  A <= 0.\n");
    exit(1);
  }
  if (m < 1) {
    pcVar1 = "  M <= 0.\n";
  }
  else {
    if (0 < n) {
      return true;
    }
    pcVar1 = "  N <= 0.\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"F_NONCENTRAL_CHECK - Warning!\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,10);
  return false;
}

Assistant:

bool f_noncentral_check ( double a, int m, int n )

//****************************************************************************80
//
//  Purpose:
//
//    F_NONCENTRAL_CHECK checks the parameters of the F noncentral PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, a parameter of the PDF.
//
//    Input, int M, N, the parameters of the PDF.
//    1 <= M,
//    1 <= N.
//
//    Output, bool F_NONCENTRAL_CHECK, is true if the parameters are legal.
//
{
  if ( a <= 0.0 )
  {
    cerr << " \n";
    cerr << "F_NONCENTRAL_CHECK - Warning!\n";
    cerr << "  A <= 0.\n";
    exit ( 1 );
  }

  if ( m <= 0 )
  {
    cerr << "\n";
    cerr << "F_NONCENTRAL_CHECK - Warning!\n";
    cerr << "  M <= 0.\n";
    return false;
  }

  if ( n <= 0 )
  {
    cerr << "\n";
    cerr << "F_NONCENTRAL_CHECK - Warning!\n";
    cerr << "  N <= 0.\n";
    return false;
  }

  return true;
}